

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void EVPinit(CManager_conflict cm)

{
  uint uVar1;
  int iVar2;
  __pid_t _Var3;
  void *pvVar4;
  undefined8 uVar5;
  time_t tVar6;
  pthread_t pVar7;
  char *__nptr;
  long in_RDI;
  CMTraceType in_stack_0000000c;
  CManager in_stack_00000010;
  char *backpressure_env;
  timespec ts;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  CManager_conflict in_stack_ffffffffffffffd0;
  CMPollFunc in_stack_ffffffffffffffd8;
  CManager_conflict in_stack_ffffffffffffffe0;
  timespec local_18;
  long local_8;
  
  local_8 = in_RDI;
  pvVar4 = INT_CMmalloc((size_t)in_stack_ffffffffffffffd0);
  *(void **)(local_8 + 0x118) = pvVar4;
  memset(*(void **)(local_8 + 0x118),0,0xd0);
  *(undefined8 *)(*(long *)(local_8 + 0x118) + 0x50) = *(undefined8 *)(local_8 + 0xb0);
  uVar5 = FMContext_from_FFS(*(undefined8 *)(*(long *)(local_8 + 0x118) + 0x50));
  *(undefined8 *)(*(long *)(local_8 + 0x118) + 0x48) = uVar5;
  *(undefined4 *)(*(long *)(local_8 + 0x118) + 4) = 0;
  if (EVPinit::first_evpinit == 0) {
    tVar6 = time((time_t *)0x0);
    srand((uint)tVar6);
    while (*(int *)(*(long *)(local_8 + 0x118) + 4) == 0) {
      uVar1 = rand();
      *(uint *)(*(long *)(local_8 + 0x118) + 4) = uVar1 & 0xffff;
    }
  }
  iVar2 = CMtrace_val[10];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar2 = CMtrace_init(in_stack_00000010,in_stack_0000000c);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffffd0 = *(CManager_conflict *)(local_8 + 0x120);
      _Var3 = getpid();
      in_stack_ffffffffffffffd8 = (CMPollFunc)(long)_Var3;
      pVar7 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffffd0,"P%lxT%lx - ",in_stack_ffffffffffffffd8,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_18);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_18.tv_sec,local_18.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"INITATED EVPATH, base stone num is %x\n",
            (ulong)*(uint *)(*(long *)(local_8 + 0x118) + 4));
  }
  fflush(*(FILE **)(local_8 + 0x120));
  EVPinit::first_evpinit = 0;
  *(undefined8 *)(*(long *)(local_8 + 0x118) + 0x58) = 0;
  pthread_mutex_init((pthread_mutex_t *)(*(long *)(local_8 + 0x118) + 0x70),
                     (pthread_mutexattr_t *)0x0);
  internal_add_shutdown_task
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  __nptr = getenv("EVBackpressure");
  if ((__nptr == (char *)0x0) || (iVar2 = atoi(__nptr), iVar2 == 0)) {
    *(undefined4 *)(*(long *)(local_8 + 0x118) + 0x98) = 0;
  }
  else {
    *(undefined4 *)(*(long *)(local_8 + 0x118) + 0x98) = 1;
  }
  INT_CMadd_poll(in_stack_ffffffffffffffd0,
                 (CMPollFunc)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (void *)0x143bcf);
  REVPinit(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void
EVPinit(CManager cm)
{
    static int first_evpinit = 1;
    cm->evp = INT_CMmalloc(sizeof( struct _event_path_data));
    memset(cm->evp, 0, sizeof( struct _event_path_data));
    cm->evp->ffsc = cm->FFScontext;
    cm->evp->fmc = FMContext_from_FFS(cm->evp->ffsc);
    cm->evp->stone_base_num = 0;
    if (!first_evpinit) {
	/* 
	 * after the first evpinit, start stones at random base number,
	 * just so that we're more likely to catch mitmatched stone/CM
	 * combos in threaded situations.
	*/
	srand((int)time(NULL));
	while (cm->evp->stone_base_num == 0) {
	    cm->evp->stone_base_num = rand() & 0xffff;
	}
    }
    CMtrace_out(cm, EVerbose, "INITATED EVPATH, base stone num is %x\n", 
		cm->evp->stone_base_num);
    first_evpinit = 0;
    cm->evp->queue_items_free_list = NULL;
    thr_mutex_init(cm->evp->lock);
    internal_add_shutdown_task(cm, free_evp, NULL, FREE_TASK);
    {
        char *backpressure_env;
        backpressure_env = getenv("EVBackpressure");
        if (backpressure_env && atoi(backpressure_env) != 0) {
            cm->evp->use_backpressure = 1;
        } else {
            cm->evp->use_backpressure = 0;
        }
    }
    INT_CMadd_poll(cm, deferred_process_actions, NULL);
    REVPinit(cm);
}